

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O3

void __thiscall Fl_Tiled_Image::color_average(Fl_Tiled_Image *this,Fl_Color c,float i)

{
  int iVar1;
  undefined4 extraout_var;
  Fl_Image *pFVar2;
  
  pFVar2 = this->image_;
  if (this->alloc_image_ == 0) {
    iVar1 = (*pFVar2->_vptr_Fl_Image[2])(pFVar2,(ulong)(uint)pFVar2->w_,(ulong)(uint)pFVar2->h_);
    pFVar2 = (Fl_Image *)CONCAT44(extraout_var,iVar1);
    this->image_ = pFVar2;
    this->alloc_image_ = 1;
  }
  (*pFVar2->_vptr_Fl_Image[3])(i,pFVar2,c);
  return;
}

Assistant:

void
Fl_Tiled_Image::color_average(Fl_Color c,	// I - Color to blend with
                              float    i) {	// I - Blend fraction
  if (!alloc_image_) {
    image_       = image_->copy();
    alloc_image_ = 1;
  }

  image_->color_average(c, i);
}